

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

bool __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::test_deleted(dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
               *this,iterator *it)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  
  if (this->num_deleted != 0) {
    iVar3 = (this->key_info).delkey;
    iVar2 = it->pos->first;
    piVar1 = &(this->key_info).super_Hasher.num_compares_;
    *piVar1 = *piVar1 + 1;
    return iVar3 == iVar2;
  }
  return false;
}

Assistant:

bool test_deleted(const iterator& it) const {
    // Invariant: !use_deleted() implies num_deleted is 0.
    assert(settings.use_deleted() || num_deleted == 0);
    return num_deleted > 0 && test_deleted_key(get_key(*it));
  }